

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O2

Value * __thiscall cmFileAPI::BuildReply(Value *__return_storage_ptr__,cmFileAPI *this,Query *q)

{
  cmFileAPI *pcVar1;
  pointer pbVar2;
  Value *pVVar3;
  Object *extraout_RDX;
  Object *o_00;
  Object *extraout_RDX_00;
  Object *o;
  cmFileAPI *this_00;
  pointer key;
  allocator<char> local_a9;
  Query *local_a8;
  string local_a0;
  Value local_80;
  Value local_58;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  pcVar1 = (cmFileAPI *)
           (q->Known).super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  o_00 = extraout_RDX;
  local_a8 = q;
  for (this_00 = (cmFileAPI *)
                 (q->Known).
                 super__Vector_base<cmFileAPI::Object,_std::allocator<cmFileAPI::Object>_>._M_impl.
                 super__Vector_impl_data._M_start; this_00 != pcVar1;
      this_00 = (cmFileAPI *)&(this_00->APIv1)._M_string_length) {
    ObjectName_abi_cxx11_(&local_a0,this_00,o_00);
    pVVar3 = AddReplyIndexObject(this,(Object *)this_00);
    Json::Value::Value(&local_58,pVVar3);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,&local_a0);
    Json::Value::operator=(pVVar3,&local_58);
    Json::Value::~Value(&local_58);
    std::__cxx11::string::~string((string *)&local_a0);
    o_00 = extraout_RDX_00;
  }
  pbVar2 = (local_a8->Unknown).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (key = (local_a8->Unknown).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; key != pbVar2; key = key + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"unknown query file",&local_a9);
    BuildReplyError(&local_80,&local_a0);
    pVVar3 = Json::Value::operator[](__return_storage_ptr__,key);
    Json::Value::operator=(pVVar3,&local_80);
    Json::Value::~Value(&local_80);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildReply(Query const& q)
{
  Json::Value reply = Json::objectValue;
  for (Object const& o : q.Known) {
    std::string const& name = ObjectName(o);
    reply[name] = this->AddReplyIndexObject(o);
  }

  for (std::string const& name : q.Unknown) {
    reply[name] = cmFileAPI::BuildReplyError("unknown query file");
  }
  return reply;
}